

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlfparser.h
# Opt level: O2

vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *
xlfparser::_fix_whitespace_tokens<char>
          (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *__return_storage_ptr__,
          vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *tokens,char *formula,
          size_t size)

{
  Type TVar1;
  pointer pTVar2;
  Token *token;
  pointer __x;
  Token local_48;
  
  (__return_storage_ptr__->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::reserve
            (__return_storage_ptr__,
             ((long)(tokens->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(tokens->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>)
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  for (__x = (tokens->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
             _M_impl.super__Vector_impl_data._M_start;
      pTVar2 = (tokens->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
               _M_impl.super__Vector_impl_data._M_finish, __x != pTVar2; __x = __x + 1) {
    if (__x->m_type == Whitespace) {
      if (((__x != pTVar2 + -1 &&
            __x != (tokens->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>)
                   ._M_impl.super__Vector_impl_data._M_start) &&
          ((TVar1 = __x[-1].m_type, TVar1 == Operand ||
           (((TVar1 == Subexpression || (TVar1 == Function)) && (__x[-1].m_subtype == Stop)))))) &&
         ((TVar1 = __x[1].m_type, TVar1 == Operand ||
          (((TVar1 == Subexpression || (TVar1 == Function)) && (__x[1].m_subtype == Start)))))) {
        local_48.m_start = __x->m_start;
        local_48.m_end = __x->m_end;
        local_48.m_type = OperatorInfix;
        local_48.m_subtype = Intersection;
        std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
        emplace_back<xlfparser::Token>(__return_storage_ptr__,&local_48);
      }
    }
    else {
      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                (__return_storage_ptr__,__x);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<Token> _fix_whitespace_tokens(const std::vector<Token> tokens,
                                                     const char_type* formula,
                                                     size_t size)
    {
        std::vector<Token> new_tokens;
        new_tokens.reserve(tokens.size());

        for (auto iter = tokens.begin(); iter != tokens.end(); ++iter)
        {
            auto& token = *iter;
            if (token.type() != Token::Type::Whitespace)
            {
                new_tokens.push_back(token);
                continue;
            }

            // Examine the previous and next tokens to see if the whitepsace is actually an intersection operator
            if (iter == tokens.begin() || iter == tokens.end()-1)
                continue;

            auto& previous = *(iter-1);
            auto& next = *(iter+1);

            // If the previous token is not the end of a function, subexpression or operand skip the whitespace
            if (!((previous.type() == Token::Type::Function && previous.subtype() == Token::Subtype::Stop) ||
                  (previous.type() == Token::Type::Subexpression && previous.subtype() == Token::Subtype::Stop) ||
                  (previous.type() == Token::Type::Operand)))
                continue;

            // If the next token is not the start of a function, subexpression or operand skip the whitespace
            if (!((next.type() == Token::Type::Function && next.subtype() == Token::Subtype::Start) ||
                  (next.type() == Token::Type::Subexpression && next.subtype() == Token::Subtype::Start) ||
                  (next.type() == Token::Type::Operand)))
                continue;

            // Space between functions, subexpressions or operands is an intersection operator
            new_tokens.push_back({token.start(),
                                  token.end(),
                                  Token::Type::OperatorInfix,
                                  Token::Subtype::Intersection});
        }

        return new_tokens;
    }